

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O1

void Abc_NodeSuperChoiceCollect_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  if ((pObj->field_0x14 & 0x20) != 0) {
    uVar1 = vLeaves->nCap;
    if (vLeaves->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc(0x80);
        }
        else {
          ppvVar2 = (void **)realloc(vLeaves->pArray,0x80);
        }
        vLeaves->pArray = ppvVar2;
        iVar3 = 0x10;
      }
      else {
        iVar3 = uVar1 * 2;
        if (iVar3 <= (int)uVar1) goto LAB_00268c95;
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar2 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
        }
        vLeaves->pArray = ppvVar2;
      }
      vLeaves->nCap = iVar3;
    }
LAB_00268c95:
    iVar3 = vLeaves->nSize;
    vLeaves->nSize = iVar3 + 1;
    vLeaves->pArray[iVar3] = pObj;
    pObj->field_0x14 = pObj->field_0x14 & 0xdf;
  }
  if ((*(uint *)&pObj->field_0x14 & 0x40) != 0) {
    return;
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
  if ((pObj->vFanins).nSize != 2) {
    __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x1c0,
                  "void Abc_NodeSuperChoiceCollect_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  Abc_NodeSuperChoiceCollect_rec
            ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vLeaves,vVolume);
  Abc_NodeSuperChoiceCollect_rec
            ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]],vLeaves,vVolume);
  uVar1 = vVolume->nCap;
  if (vVolume->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vVolume->pArray,0x80);
      }
      vVolume->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_00268d79;
      if (vVolume->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vVolume->pArray,(ulong)uVar1 << 4);
      }
      vVolume->pArray = ppvVar2;
    }
    vVolume->nCap = iVar3;
  }
LAB_00268d79:
  iVar3 = vVolume->nSize;
  vVolume->nSize = iVar3 + 1;
  vVolume->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    if ( pObj->fMarkB )
    {
        Vec_PtrPush( vLeaves, pObj );
        pObj->fMarkB = 0;
    }
    if ( pObj->fMarkC )
        return;
    pObj->fMarkC = 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    Abc_NodeSuperChoiceCollect_rec( Abc_ObjFanin0(pObj), vLeaves, vVolume );
    Abc_NodeSuperChoiceCollect_rec( Abc_ObjFanin1(pObj), vLeaves, vVolume );
    Vec_PtrPush( vVolume, pObj );
}